

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::internal::KeyMapBase<bool>::MergeIntoEmpty
          (KeyMapBase<bool> *this,NodeBase *head,size_t num_nodes)

{
  size_t this_00;
  bool bVar1;
  map_index_t b;
  size_type sVar2;
  char *pcVar3;
  LogMessage *pLVar4;
  uint *puVar5;
  KeyNode *node;
  undefined1 local_98 [4];
  map_index_t needed_capacity;
  Voidify local_81;
  unsigned_long local_80;
  unsigned_long local_78;
  Nullable<const_char_*> local_70;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_58;
  Voidify local_41;
  unsigned_long local_40;
  unsigned_long local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  size_t num_nodes_local;
  NodeBase *head_local;
  KeyMapBase<bool> *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)num_nodes;
  num_nodes_local = (size_t)head;
  head_local = (NodeBase *)this;
  sVar2 = internal::UntypedMapBase::size(&this->super_UntypedMapBase);
  local_38 = absl::lts_20250127::log_internal::GetReferenceableValue(sVar2);
  local_40 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_30 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                       (&local_38,&local_40,"size() == size_t{0}");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
               ,0x376,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_58);
  }
  local_78 = absl::lts_20250127::log_internal::GetReferenceableValue
                       ((unsigned_long)absl_log_internal_check_op_result);
  local_80 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_70 = absl::lts_20250127::log_internal::Check_NEImpl<unsigned_long,unsigned_long>
                       (&local_78,&local_80,"num_nodes != size_t{0}");
  if (local_70 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_70);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
               ,0x377,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)local_98);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_81,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_98)
    ;
  }
  sVar2 = CalculateCapacityForSize((size_type)absl_log_internal_check_op_result);
  node._4_4_ = (map_index_t)sVar2;
  if (node._4_4_ != (this->super_UntypedMapBase).num_buckets_) {
    puVar5 = std::max<unsigned_int>
                       (&internal::UntypedMapBase::kMinTableSize,(uint *)((long)&node + 4));
    Resize(this,*puVar5);
  }
  (this->super_UntypedMapBase).num_elements_ = (map_index_t)absl_log_internal_check_op_result;
  AssertLoadFactor(this);
  while (this_00 = num_nodes_local, num_nodes_local != 0) {
    num_nodes_local = *(size_t *)num_nodes_local;
    this_local = (KeyMapBase<bool> *)num_nodes_local;
    bVar1 = KeyNode<bool>::key((KeyNode<bool> *)this_00);
    bVar1 = TransparentSupport<bool>::ToView(bVar1);
    b = BucketNumber(this,bVar1);
    InsertUnique(this,b,(KeyNode *)this_00);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void MergeIntoEmpty(NodeBase* head, size_t num_nodes) {
    ABSL_DCHECK_EQ(size(), size_t{0});
    ABSL_DCHECK_NE(num_nodes, size_t{0});
    if (const map_index_t needed_capacity = CalculateCapacityForSize(num_nodes);
        needed_capacity != this->num_buckets_) {
      Resize(std::max(kMinTableSize, needed_capacity));
    }
    num_elements_ = num_nodes;
    AssertLoadFactor();
    while (head != nullptr) {
      KeyNode* node = static_cast<KeyNode*>(head);
      head = head->next;
      absl::PrefetchToLocalCacheNta(head);
      InsertUnique(BucketNumber(TS::ToView(node->key())), node);
    }
  }